

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionMessage.cpp
# Opt level: O1

size_t __thiscall
helics::ActionMessage::depacketize(ActionMessage *this,void *data,size_t buffer_size)

{
  bool bVar1;
  size_t sVar2;
  byte *bytes;
  ulong uVar3;
  ulong buffer_size_00;
  string_view data_00;
  
  sVar2 = 0;
  if ((5 < buffer_size) && (*data == -0xd)) {
    uVar3 = (ulong)((uint)*(byte *)((long)data + 2) << 8 | (uint)*(byte *)((long)data + 1) << 0x10);
    if ((buffer_size < uVar3 + *(byte *)((long)data + 3) + 2) ||
       ((uVar3 = uVar3 | *(byte *)((long)data + 3), *(char *)((long)data + uVar3) != -6 ||
        (*(char *)((long)data + uVar3 + 1) != -4)))) {
      sVar2 = 0;
    }
    else {
      buffer_size_00 = (ulong)((int)uVar3 - 4);
      sVar2 = fromByteArray(this,(byte *)((long)data + 4),buffer_size_00);
      if (sVar2 == 0) {
        data_00._M_str = (char *)((long)data + 4);
        data_00._M_len = buffer_size_00;
        bVar1 = from_json_string(this,data_00);
        bVar1 = !bVar1;
      }
      else {
        bVar1 = false;
      }
      sVar2 = 0;
      if (!bVar1) {
        sVar2 = (ulong)((int)uVar3 + 2);
      }
    }
  }
  return sVar2;
}

Assistant:

std::size_t ActionMessage::depacketize(const void* data, std::size_t buffer_size)
{
    const auto* bytes = reinterpret_cast<const std::byte*>(data);
    if (bytes[0] != static_cast<std::byte>(LEADING_CHAR)) {
        return 0;
    }
    if (buffer_size < 6) {
        return 0;
    }
    unsigned int message_size = std::to_integer<unsigned char>(bytes[1]);
    message_size <<= 8U;
    message_size += static_cast<unsigned char>(bytes[2]);
    message_size <<= 8U;
    message_size += static_cast<unsigned char>(bytes[3]);
    if (buffer_size < (static_cast<size_t>(message_size) + 2)) {
        return 0;
    }
    if (bytes[message_size] != static_cast<std::byte>(TAIL_CHAR1)) {
        return 0;
    }
    if (bytes[message_size + 1] != static_cast<std::byte>(TAIL_CHAR2)) {
        return 0;
    }

    std::size_t bytesUsed = fromByteArray(bytes + 4, message_size - 4);
    if (bytesUsed == 0U) {
        if (from_json_string(
                std::string_view(reinterpret_cast<const char*>(bytes) + 4, message_size - 4))) {
            bytesUsed = static_cast<std::size_t>(message_size) + 4;
        }
    }
    return (bytesUsed > 0) ? message_size + 2 : 0;
}